

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O2

string_view RenX::translateWinType(WinType winType)

{
  size_t *psVar1;
  undefined **ppuVar2;
  string_view sVar3;
  
  if (winType < Unknown) {
    psVar1 = (size_t *)(&PTR__ZL23scoreWinTypeTranslation_0_00165138)[winType];
    ppuVar2 = (undefined **)(&PTR__ZL23scoreWinTypeTranslation_1_00165168)[winType];
  }
  else {
    ppuVar2 = &_ZL25unknownWinTypeTranslation_1;
    psVar1 = &_ZL25unknownWinTypeTranslation_0;
  }
  sVar3._M_str = *ppuVar2;
  sVar3._M_len = *psVar1;
  return sVar3;
}

Assistant:

std::string_view RenX::translateWinType(RenX::WinType winType)
{
	switch (winType)
	{
	case RenX::WinType::Score:
		return scoreWinTypeTranslation;
	case RenX::WinType::Base:
		return baseWinTypeTranslation;
	case RenX::WinType::Beacon:
		return beaconWinTypeTranslation;
	case RenX::WinType::Tie:
		return tieWinTypeTranslation;
	case RenX::WinType::Shutdown:
		return shutdownWinTypeTranslation;
	case RenX::WinType::Surrender:
		return surrenderWinTypeTranslation;
	case RenX::WinType::Unknown:
	default:
		return unknownWinTypeTranslation;
	}
}